

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

void __thiscall
capnp::compiler::CompilerMain::readOneAndConvert
          (CompilerMain *this,BufferedInputStreamWrapper *input,OutputStream *output)

{
  RawBrandedSchema *pRVar1;
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Builder output_00;
  Reader reader_02;
  Reader reader_03;
  Builder output_01;
  Reader reader_04;
  SegmentReader *pSVar2;
  uchar *puVar3;
  RemoveConst<unsigned_char> *pRVar4;
  uchar *puVar5;
  Disposer *pDVar6;
  capnp *pcVar7;
  size_t extraout_RDX;
  capnp *pcVar8;
  Impl *pIVar9;
  ulong uVar10;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ArrayPtr<const_char> input_00;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_unsigned_char> array;
  ArrayPtr<unsigned_char> dstArray;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  StringPtr input_01;
  ReaderOptions options;
  ReaderOptions options_00;
  ReaderOptions options_01;
  ReaderOptions options_02;
  Vector<unsigned_char> allBytes;
  Array<capnp::word> words;
  DebugExpression<bool> _kjCondition;
  Fault f;
  PackedInputStream unpacker;
  ArrayPtr<const_capnp::word> segments [1];
  word dummy;
  SegmentArrayMessageReader message;
  ArrayPtr<const_capnp::word> segments_1 [1];
  ParseErrorCatcher parseErrorCatcher;
  Vector<unsigned_char> local_4c8;
  JsonCodec local_4a8;
  undefined8 *local_498;
  undefined1 local_488 [16];
  WirePointer *local_478;
  int iStack_470;
  undefined4 uStack_46c;
  undefined8 local_468;
  undefined8 uStack_460;
  PointerReader local_458;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  PackedInputStream local_418;
  ArrayInputStream local_408;
  uchar local_3e8 [8];
  undefined1 local_3e0 [312];
  StructReader local_2a8;
  StructReader local_278;
  StructReader local_248;
  StructReader local_218;
  ArrayPtr<const_capnp::word> local_1e8;
  ParseErrorCatcher local_1d8;
  
  ParseErrorCatcher::ParseErrorCatcher(&local_1d8,this->context);
  switch(this->convertFrom) {
  case BINARY:
    options._8_8_ = 0x7fffffff;
    options.traversalLimitInWords = 0xffffffffffffffff;
    InputStreamMessageReader::InputStreamMessageReader
              ((InputStreamMessageReader *)local_3e0,(InputStream *)input,options,
               (ArrayPtr<capnp::word>)ZEXT816(0));
    MessageReader::getRootInternal((Reader *)local_488,(MessageReader *)local_3e0);
    local_458.segment = (SegmentReader *)CONCAT71(local_488._1_7_,local_488[0]);
    local_458.pointer = local_478;
    local_458.nestingLimit = iStack_470;
    local_458._28_4_ = uStack_46c;
    local_458.capTable = (CapTableReader *)local_488._8_8_;
    capnp::_::PointerReader::getStruct(&local_218,&local_458,(word *)0x0);
    reader_00._reader.capTable = local_218.capTable;
    reader_00._reader.segment = local_218.segment;
    reader_00._reader.data = local_218.data;
    reader_00._reader.pointers = local_218.pointers;
    reader_00._reader.dataSize = local_218.dataSize;
    reader_00._reader.pointerCount = local_218.pointerCount;
    reader_00._reader._38_2_ = local_218._38_2_;
    reader_00._reader.nestingLimit = local_218.nestingLimit;
    reader_00._reader._44_4_ = local_218._44_4_;
    writeConversion(this,reader_00,output);
    InputStreamMessageReader::~InputStreamMessageReader((InputStreamMessageReader *)local_3e0);
    break;
  case PACKED:
    options_00._8_8_ = 0x7fffffff;
    options_00.traversalLimitInWords = 0xffffffffffffffff;
    PackedMessageReader::PackedMessageReader
              ((PackedMessageReader *)local_3e0,&input->super_BufferedInputStream,options_00,
               (ArrayPtr<capnp::word>)ZEXT816(0));
    MessageReader::getRootInternal((Reader *)local_488,(MessageReader *)(local_3e0 + 0x10));
    local_458.segment = (SegmentReader *)CONCAT71(local_488._1_7_,local_488[0]);
    local_458.pointer = local_478;
    local_458.nestingLimit = iStack_470;
    local_458._28_4_ = uStack_46c;
    local_458.capTable = (CapTableReader *)local_488._8_8_;
    capnp::_::PointerReader::getStruct(&local_248,&local_458,(word *)0x0);
    reader_01._reader.capTable = local_248.capTable;
    reader_01._reader.segment = local_248.segment;
    reader_01._reader.data = local_248.data;
    reader_01._reader.pointers = local_248.pointers;
    reader_01._reader.dataSize = local_248.dataSize;
    reader_01._reader.pointerCount = local_248.pointerCount;
    reader_01._reader._38_2_ = local_248._38_2_;
    reader_01._reader.nestingLimit = local_248.nestingLimit;
    reader_01._reader._44_4_ = local_248._44_4_;
    writeConversion(this,reader_01,output);
    PackedMessageReader::~PackedMessageReader((PackedMessageReader *)local_3e0);
    break;
  case FLAT:
  case CANONICAL:
    readAll(&local_4c8,this,input);
    uVar10 = (long)local_4c8.builder.pos - (long)local_4c8.builder.ptr;
    pIVar9 = (Impl *)(uVar10 >> 3);
    local_4a8.impl.disposer =
         (Disposer *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (8,(size_t)pIVar9,(size_t)pIVar9,(_func_void_void_ptr *)0x0,
                    (_func_void_void_ptr *)0x0);
    local_498 = &kj::_::HeapArrayDisposer::instance;
    local_4a8.impl.ptr = pIVar9;
    memcpy(local_4a8.impl.disposer,local_4c8.builder.ptr,uVar10 & 0xfffffffffffffff8);
    local_408.super_BufferedInputStream.super_InputStream._vptr_InputStream =
         (InputStream)(InputStream)local_4a8.impl.disposer;
    local_408.array.ptr = &(local_4a8.impl.ptr)->prettyPrint;
    segments_00.size_ = 1;
    segments_00.ptr = (ArrayPtr<const_capnp::word> *)&local_408;
    options_01._8_8_ = 0x7fffffff;
    options_01.traversalLimitInWords = 0xffffffffffffffff;
    SegmentArrayMessageReader::SegmentArrayMessageReader
              ((SegmentArrayMessageReader *)local_3e0,segments_00,options_01);
    if ((this->convertFrom == CANONICAL) &&
       (local_488[0] = MessageReader::isCanonical((MessageReader *)local_3e0), !local_488[0])) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                ((Fault *)&local_458,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                 ,0x423,FAILED,"message.isCanonical()","_kjCondition,",
                 (DebugExpression<bool> *)local_488);
      kj::_::Debug::Fault::fatal((Fault *)&local_458);
    }
    MessageReader::getRootInternal((Reader *)local_488,(MessageReader *)local_3e0);
    local_458.segment = (SegmentReader *)CONCAT71(local_488._1_7_,local_488[0]);
    local_458.pointer = local_478;
    local_458.nestingLimit = iStack_470;
    local_458._28_4_ = uStack_46c;
    local_458.capTable = (CapTableReader *)local_488._8_8_;
    capnp::_::PointerReader::getStruct(&local_278,&local_458,(word *)0x0);
    reader._reader.capTable = local_278.capTable;
    reader._reader.segment = local_278.segment;
    reader._reader.data = local_278.data;
    reader._reader.pointers = local_278.pointers;
    reader._reader.dataSize = local_278.dataSize;
    reader._reader.pointerCount = local_278.pointerCount;
    reader._reader._38_2_ = local_278._38_2_;
    reader._reader.nestingLimit = local_278.nestingLimit;
    reader._reader._44_4_ = local_278._44_4_;
    writeConversion(this,reader,output);
    SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_3e0);
    pIVar9 = local_4a8.impl.ptr;
    pDVar6 = local_4a8.impl.disposer;
    if (local_4a8.impl.disposer != (Disposer *)0x0) {
      local_4a8.impl.disposer = (Disposer *)0x0;
      local_4a8.impl.ptr = (Impl *)0x0;
      (**(code **)*local_498)(local_498,pDVar6,8,pIVar9,pIVar9,0);
    }
    puVar5 = local_4c8.builder.endPtr;
    pRVar4 = local_4c8.builder.pos;
    puVar3 = local_4c8.builder.ptr;
    if ((capnp *)local_4c8.builder.ptr != (capnp *)0x0) {
      local_4c8.builder.ptr = (uchar *)0x0;
      local_4c8.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      local_4c8.builder.endPtr = (uchar *)0x0;
      (**(local_4c8.builder.disposer)->_vptr_ArrayDisposer)
                (local_4c8.builder.disposer,puVar3,1,(long)pRVar4 - (long)puVar3,
                 (long)puVar5 - (long)puVar3,0);
    }
    break;
  case FLAT_PACKED:
    readAll(&local_4c8,this,input);
    packedBytes.ptr = (capnp *)(local_4c8.builder.pos + -(long)local_4c8.builder.ptr);
    packedBytes.size_ = extraout_RDX;
    pIVar9 = (Impl *)computeUnpackedSizeInWords((capnp *)local_4c8.builder.ptr,packedBytes);
    local_4a8.impl.disposer =
         (Disposer *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (8,(size_t)pIVar9,(size_t)pIVar9,(_func_void_void_ptr *)0x0,
                    (_func_void_void_ptr *)0x0);
    local_498 = &kj::_::HeapArrayDisposer::instance;
    array.size_ = (long)local_4c8.builder.pos - (long)local_4c8.builder.ptr;
    array.ptr = local_4c8.builder.ptr;
    local_4a8.impl.ptr = pIVar9;
    kj::ArrayInputStream::ArrayInputStream(&local_408,array);
    capnp::_::PackedInputStream::PackedInputStream(&local_418,&local_408.super_BufferedInputStream);
    kj::InputStream::read
              (&local_418.super_InputStream,(int)local_4a8.impl.disposer,
               (void *)((long)local_4a8.impl.ptr << 3),(size_t)((long)local_4a8.impl.ptr << 3));
    dstArray.size_ = 8;
    dstArray.ptr = local_3e8;
    local_3e0._0_8_ = capnp::_::PackedInputStream::tryRead(&local_418,dstArray,8);
    local_3e0._8_4_ = 0;
    local_3e0._16_8_ = " == ";
    local_3e0._24_8_ = (void *)0x5;
    local_3e0[0x20] = (_func_int **)local_3e0._0_8_ == (_func_int **)0x0;
    if (!local_3e0[0x20]) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                ((Fault *)&local_458,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                 ,0x42f,FAILED,
                 "unpacker.tryRead(kj::arrayPtr(&dummy, 1).asBytes(), sizeof(dummy)) == 0",
                 "_kjCondition,",(DebugComparison<unsigned_long,_int> *)local_3e0);
      kj::_::Debug::Fault::fatal((Fault *)&local_458);
    }
    local_1e8.ptr = (word *)local_4a8.impl.disposer;
    local_1e8.size_ = (size_t)local_4a8.impl.ptr;
    segments_01.size_ = 1;
    segments_01.ptr = &local_1e8;
    options_02._8_8_ = 0x7fffffff;
    options_02.traversalLimitInWords = 0xffffffffffffffff;
    SegmentArrayMessageReader::SegmentArrayMessageReader
              ((SegmentArrayMessageReader *)local_3e0,segments_01,options_02);
    MessageReader::getRootInternal((Reader *)local_488,(MessageReader *)local_3e0);
    local_458.segment = (SegmentReader *)CONCAT71(local_488._1_7_,local_488[0]);
    local_458.pointer = local_478;
    local_458.nestingLimit = iStack_470;
    local_458._28_4_ = uStack_46c;
    local_458.capTable = (CapTableReader *)local_488._8_8_;
    capnp::_::PointerReader::getStruct(&local_2a8,&local_458,(word *)0x0);
    reader_03._reader.capTable = local_2a8.capTable;
    reader_03._reader.segment = local_2a8.segment;
    reader_03._reader.data = local_2a8.data;
    reader_03._reader.pointers = local_2a8.pointers;
    reader_03._reader.dataSize = local_2a8.dataSize;
    reader_03._reader.pointerCount = local_2a8.pointerCount;
    reader_03._reader._38_2_ = local_2a8._38_2_;
    reader_03._reader.nestingLimit = local_2a8.nestingLimit;
    reader_03._reader._44_4_ = local_2a8._44_4_;
    writeConversion(this,reader_03,output);
    SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_3e0);
    capnp::_::PackedInputStream::~PackedInputStream(&local_418);
    kj::BufferedInputStream::~BufferedInputStream(&local_408.super_BufferedInputStream);
    pIVar9 = local_4a8.impl.ptr;
    pDVar6 = local_4a8.impl.disposer;
    if (local_4a8.impl.disposer != (Disposer *)0x0) {
      local_4a8.impl.disposer = (Disposer *)0x0;
      local_4a8.impl.ptr = (Impl *)0x0;
      (**(code **)*local_498)(local_498,pDVar6,8,pIVar9,pIVar9,0);
    }
    puVar5 = local_4c8.builder.endPtr;
    pRVar4 = local_4c8.builder.pos;
    puVar3 = local_4c8.builder.ptr;
    if ((capnp *)local_4c8.builder.ptr != (capnp *)0x0) {
      local_4c8.builder.ptr = (uchar *)0x0;
      local_4c8.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      local_4c8.builder.endPtr = (uchar *)0x0;
      (**(local_4c8.builder.disposer)->_vptr_ArrayDisposer)
                (local_4c8.builder.disposer,puVar3,1,(long)pRVar4 - (long)puVar3,
                 (long)puVar5 - (long)puVar3,0);
    }
    break;
  case TEXT:
    readOneText((String *)&local_4c8,this,input);
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)local_3e0,0x400,GROW_HEURISTICALLY);
    TextCodec::TextCodec((TextCodec *)&local_4a8);
    TextCodec::setPrettyPrint((TextCodec *)&local_4a8,this->pretty);
    pRVar1 = (this->rootType).super_Schema.raw;
    MessageBuilder::getRootInternal((Builder *)&local_458,(MessageBuilder *)local_3e0);
    capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
              ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)local_488,
               (EVP_PKEY_CTX *)pRVar1);
    pcVar8 = (capnp *)local_4c8.builder.ptr;
    if ((capnp *)local_4c8.builder.pos == (capnp *)0x0) {
      pcVar8 = (capnp *)0x237f1b;
    }
    input_01.content.size_ =
         (capnp *)(local_4c8.builder.pos + ((capnp *)local_4c8.builder.pos == (capnp *)0x0));
    output_01.schema.super_Schema.raw._1_7_ = local_488._1_7_;
    output_01.schema.super_Schema.raw._0_1_ = local_488[0];
    output_01.builder.segment = (SegmentBuilder *)local_488._8_8_;
    output_01.builder.capTable = (CapTableBuilder *)local_478;
    output_01.builder.data = (void *)_iStack_470;
    output_01.builder.pointers = (WirePointer *)local_468;
    output_01.builder.dataSize = (undefined4)uStack_460;
    output_01.builder.pointerCount = uStack_460._4_2_;
    output_01.builder._38_2_ = uStack_460._6_2_;
    input_01.content.ptr = (char *)pcVar8;
    TextCodec::decode((TextCodec *)&local_4a8,input_01,output_01);
    pSVar2 = (SegmentReader *)CONCAT71(local_488._1_7_,local_488[0]);
    capnp::_::StructBuilder::asReader((StructBuilder *)(local_488 + 8));
    reader_04._reader.capTable = (CapTableReader *)local_458.pointer;
    reader_04._reader.segment = (SegmentReader *)local_458.capTable;
    reader_04._reader.data = (void *)local_458._24_8_;
    reader_04._reader.pointers = (WirePointer *)uStack_438;
    reader_04._reader.dataSize = (undefined4)local_430;
    reader_04._reader.pointerCount = local_430._4_2_;
    reader_04._reader._38_2_ = local_430._6_2_;
    reader_04._reader._40_8_ = uStack_428;
    local_458.segment = pSVar2;
    writeConversion(this,reader_04,output);
    TextCodec::~TextCodec((TextCodec *)&local_4a8);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_3e0);
    pRVar4 = local_4c8.builder.pos;
    puVar3 = local_4c8.builder.ptr;
    if ((capnp *)local_4c8.builder.ptr != (capnp *)0x0) {
      local_4c8.builder.ptr = (uchar *)0x0;
      local_4c8.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      (*(code *)**(undefined8 **)local_4c8.builder.endPtr)
                (local_4c8.builder.endPtr,puVar3,1,pRVar4,pRVar4,0);
    }
    break;
  case JSON:
    readOneJson((String *)&local_4c8,this,input);
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)local_3e0,0x400,GROW_HEURISTICALLY);
    JsonCodec::JsonCodec(&local_4a8);
    JsonCodec::setPrettyPrint(&local_4a8,this->pretty);
    JsonCodec::handleByAnnotation(&local_4a8,(this->rootType).super_Schema.raw);
    pRVar1 = (this->rootType).super_Schema.raw;
    MessageBuilder::getRootInternal((Builder *)&local_458,(MessageBuilder *)local_3e0);
    capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
              ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)local_488,
               (EVP_PKEY_CTX *)pRVar1);
    pcVar8 = (capnp *)local_4c8.builder.pos;
    if ((capnp *)local_4c8.builder.pos != (capnp *)0x0) {
      pcVar8 = (capnp *)local_4c8.builder.ptr;
    }
    pcVar7 = (capnp *)0x0;
    if ((capnp *)local_4c8.builder.pos != (capnp *)0x0) {
      pcVar7 = (capnp *)(local_4c8.builder.pos + -1);
    }
    output_00.schema.super_Schema.raw._1_7_ = local_488._1_7_;
    output_00.schema.super_Schema.raw._0_1_ = local_488[0];
    output_00.builder.segment = (SegmentBuilder *)local_488._8_8_;
    output_00.builder.capTable = (CapTableBuilder *)local_478;
    output_00.builder.data = (void *)_iStack_470;
    output_00.builder.pointers = (WirePointer *)local_468;
    output_00.builder.dataSize = (undefined4)uStack_460;
    output_00.builder.pointerCount = uStack_460._4_2_;
    output_00.builder._38_2_ = uStack_460._6_2_;
    input_00.size_ = (size_t)pcVar7;
    input_00.ptr = (char *)pcVar8;
    JsonCodec::decode(&local_4a8,input_00,output_00);
    pSVar2 = (SegmentReader *)CONCAT71(local_488._1_7_,local_488[0]);
    capnp::_::StructBuilder::asReader((StructBuilder *)(local_488 + 8));
    reader_02._reader.capTable = (CapTableReader *)local_458.pointer;
    reader_02._reader.segment = (SegmentReader *)local_458.capTable;
    reader_02._reader.data = (void *)local_458._24_8_;
    reader_02._reader.pointers = (WirePointer *)uStack_438;
    reader_02._reader.dataSize = (undefined4)local_430;
    reader_02._reader.pointerCount = local_430._4_2_;
    reader_02._reader._38_2_ = local_430._6_2_;
    reader_02._reader._40_8_ = uStack_428;
    local_458.segment = pSVar2;
    writeConversion(this,reader_02,output);
    JsonCodec::~JsonCodec(&local_4a8);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_3e0);
    pRVar4 = local_4c8.builder.pos;
    puVar3 = local_4c8.builder.ptr;
    if ((capnp *)local_4c8.builder.ptr != (capnp *)0x0) {
      local_4c8.builder.ptr = (uchar *)0x0;
      local_4c8.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      (*(code *)**(undefined8 **)local_4c8.builder.endPtr)
                (local_4c8.builder.endPtr,puVar3,1,pRVar4,pRVar4,0);
    }
    break;
  default:
    kj::_::unreachable();
  }
  ParseErrorCatcher::~ParseErrorCatcher(&local_1d8);
  return;
}

Assistant:

void readOneAndConvert(kj::BufferedInputStreamWrapper& input, kj::OutputStream& output) {
    // Since this is a debug tool, lift the usual security limits.  Worse case is the process
    // crashes or has to be killed.
    ReaderOptions options;
    options.nestingLimit = kj::maxValue;
    options.traversalLimitInWords = kj::maxValue;

    ParseErrorCatcher parseErrorCatcher(context);

    switch (convertFrom) {
      case Format::BINARY: {
        capnp::InputStreamMessageReader message(input, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::PACKED: {
        capnp::PackedMessageReader message(input, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::FLAT:
      case Format::CANONICAL: {
        auto allBytes = readAll(input);

        // Technically we don't know if the bytes are aligned so we'd better copy them to a new
        // array. Note that if we have a non-whole number of words we chop off the straggler
        // bytes. This is fine because if those bytes are actually part of the message we will
        // hit an error later and if they are not then who cares?
        auto words = kj::heapArray<word>(allBytes.size() / sizeof(word));
        memcpy(words.begin(), allBytes.begin(), words.size() * sizeof(word));

        kj::ArrayPtr<const word> segments[1] = { words };
        SegmentArrayMessageReader message(segments, options);
        if (convertFrom == Format::CANONICAL) {
          KJ_REQUIRE(message.isCanonical());
        }
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::FLAT_PACKED: {
        auto allBytes = readAll(input);

        auto words = kj::heapArray<word>(computeUnpackedSizeInWords(allBytes));
        kj::ArrayInputStream input(allBytes);
        capnp::_::PackedInputStream unpacker(input);
        unpacker.read(words.asBytes());
        word dummy;
        KJ_ASSERT(unpacker.tryRead(kj::arrayPtr(&dummy, 1).asBytes(), sizeof(dummy)) == 0);

        kj::ArrayPtr<const word> segments[1] = { words };
        SegmentArrayMessageReader message(segments, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::TEXT: {
        auto text = readOneText(input);
        MallocMessageBuilder message;
        TextCodec codec;
        codec.setPrettyPrint(pretty);
        auto root = message.initRoot<DynamicStruct>(rootType);
        codec.decode(text, root);
        return writeConversion(root.asReader(), output);
      }
      case Format::JSON: {
        auto text = readOneJson(input);
        MallocMessageBuilder message;
        JsonCodec codec;
        codec.setPrettyPrint(pretty);
        codec.handleByAnnotation(rootType);
        auto root = message.initRoot<DynamicStruct>(rootType);
        codec.decode(text, root);
        return writeConversion(root.asReader(), output);
      }
    }

    KJ_UNREACHABLE;
  }